

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O3

void err_logfp_cb(void *user_data,err_lvl_t lvl,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  FILE *__s;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_d8;
  void **local_d0;
  undefined1 *local_c8;
  undefined1 local_b8 [24];
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  __s = (FILE *)logfp;
  if (logfp == (FILE *)0x0) {
    __s = _stderr;
  }
  if (__s != (FILE *)0x0 && (logfp_disabled & 1) == 0) {
    local_c8 = local_b8;
    local_d0 = &ap[0].overflow_arg_area;
    local_d8 = 0x3000000018;
    local_a0 = in_RCX;
    local_98 = in_R8;
    local_90 = in_R9;
    vfprintf(__s,fmt,&local_d8);
    fflush(__s);
  }
  return;
}

Assistant:

void
err_logfp_cb(void *user_data, err_lvl_t lvl, const char *fmt, ...)
{
    va_list ap;
    FILE *fp = err_get_logfp();

    if (!fp)
        return;
    
    va_start(ap, fmt);
    vfprintf(fp, fmt, ap);
    va_end(ap);
    fflush(fp);
}